

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O3

void __thiscall google::protobuf::internal::ExtensionSet::Extension::Clear(Extension *this)

{
  LongSooRep *pLVar1;
  ulong uVar2;
  undefined8 *puVar3;
  int iVar4;
  Extension *pEVar5;
  byte bVar6;
  uint uVar7;
  long *plVar9;
  uint extraout_EDX;
  uint extraout_EDX_00;
  AllocatedData extraout_RDX;
  FieldDescriptor *extraout_RDX_00;
  AllocatedData AVar10;
  int key;
  int in_ESI;
  ExtensionSet *pEVar11;
  ExtensionSet *pEVar12;
  FieldDescriptor *in_R8;
  bool bVar13;
  pair<google::protobuf::internal::ExtensionSet::Extension_*,_bool> pVar14;
  ExtensionSet EStack_80;
  ExtensionSet EStack_58;
  ExtensionSet EStack_40;
  long *plVar8;
  
  pEVar12 = (ExtensionSet *)&stack0xffffffffffffffd8;
  if (this->is_repeated == true) {
    uVar7 = this->type - 0x13;
    plVar8 = (long *)(ulong)uVar7;
    if (0xed < (byte)uVar7) {
      switch(*(undefined4 *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)this->type * 4)) {
      case 1:
      case 8:
        pLVar1 = *(LongSooRep **)&(this->field_0).int32_t_value;
        uVar2 = pLVar1->elements_int;
        if ((uVar2 & 4) != 0) {
          EStack_40.map_.flat = (KeyValue *)0x257988;
          LongSooRep::elements(pLVar1);
        }
        bVar13 = (uVar2 & 4) == 0;
        EStack_40.map_.flat = (KeyValue *)0x25799c;
        SooRep::size((SooRep *)pLVar1,bVar13);
        EStack_40.map_.flat = (KeyValue *)0x2579a6;
        iVar4 = SooRep::size((SooRep *)pLVar1,bVar13);
        if ((iVar4 != 0) && ((pLVar1->elements_int & 4) != 0)) {
          EStack_40.map_.flat = (KeyValue *)0x2579b7;
          LongSooRep::elements(pLVar1);
        }
        RepeatedField<int>::set_size((RepeatedField<int> *)pLVar1,(uVar2 & 4) == 0,0);
        return;
      case 2:
        pLVar1 = *(LongSooRep **)&(this->field_0).int32_t_value;
        uVar2 = pLVar1->elements_int;
        if ((uVar2 & 4) != 0) {
          EStack_40.map_.flat = (KeyValue *)0x257ab5;
          LongSooRep::elements(pLVar1);
        }
        bVar13 = (uVar2 & 4) == 0;
        EStack_40.map_.flat = (KeyValue *)0x257ac9;
        SooRep::size((SooRep *)pLVar1,bVar13);
        EStack_40.map_.flat = (KeyValue *)0x257ad3;
        iVar4 = SooRep::size((SooRep *)pLVar1,bVar13);
        if ((iVar4 != 0) && ((pLVar1->elements_int & 4) != 0)) {
          EStack_40.map_.flat = (KeyValue *)0x257ae4;
          LongSooRep::elements(pLVar1);
        }
        RepeatedField<long>::set_size((RepeatedField<long> *)pLVar1,(uVar2 & 4) == 0,0);
        return;
      case 3:
        pLVar1 = *(LongSooRep **)&(this->field_0).int32_t_value;
        uVar2 = pLVar1->elements_int;
        if ((uVar2 & 4) != 0) {
          EStack_40.map_.flat = (KeyValue *)0x257b14;
          LongSooRep::elements(pLVar1);
        }
        break;
      case 4:
        pLVar1 = *(LongSooRep **)&(this->field_0).int32_t_value;
        uVar2 = pLVar1->elements_int;
        if ((uVar2 & 4) != 0) {
          EStack_40.map_.flat = (KeyValue *)0x257a46;
          LongSooRep::elements(pLVar1);
        }
        bVar13 = (uVar2 & 4) == 0;
        EStack_40.map_.flat = (KeyValue *)0x257a5a;
        SooRep::size((SooRep *)pLVar1,bVar13);
        EStack_40.map_.flat = (KeyValue *)0x257a64;
        iVar4 = SooRep::size((SooRep *)pLVar1,bVar13);
        if ((iVar4 != 0) && ((pLVar1->elements_int & 4) != 0)) {
          EStack_40.map_.flat = (KeyValue *)0x257a75;
          LongSooRep::elements(pLVar1);
        }
        RepeatedField<unsigned_long>::set_size
                  ((RepeatedField<unsigned_long> *)pLVar1,(uVar2 & 4) == 0,0);
        return;
      case 5:
        pLVar1 = *(LongSooRep **)&(this->field_0).int32_t_value;
        uVar2 = pLVar1->elements_int;
        if ((uVar2 & 4) != 0) {
          EStack_40.map_.flat = (KeyValue *)0x257bd2;
          LongSooRep::elements(pLVar1);
        }
        bVar13 = (uVar2 & 4) == 0;
        EStack_40.map_.flat = (KeyValue *)0x257be6;
        SooRep::size((SooRep *)pLVar1,bVar13);
        EStack_40.map_.flat = (KeyValue *)0x257bf0;
        iVar4 = SooRep::size((SooRep *)pLVar1,bVar13);
        if ((iVar4 != 0) && ((pLVar1->elements_int & 4) != 0)) {
          EStack_40.map_.flat = (KeyValue *)0x257c01;
          LongSooRep::elements(pLVar1);
        }
        RepeatedField<double>::set_size((RepeatedField<double> *)pLVar1,(uVar2 & 4) == 0,0);
        return;
      case 6:
        pLVar1 = *(LongSooRep **)&(this->field_0).int32_t_value;
        uVar2 = pLVar1->elements_int;
        if ((uVar2 & 4) != 0) {
          EStack_40.map_.flat = (KeyValue *)0x257c31;
          LongSooRep::elements(pLVar1);
        }
        bVar13 = (uVar2 & 4) == 0;
        EStack_40.map_.flat = (KeyValue *)0x257c45;
        SooRep::size((SooRep *)pLVar1,bVar13);
        EStack_40.map_.flat = (KeyValue *)0x257c4f;
        iVar4 = SooRep::size((SooRep *)pLVar1,bVar13);
        if ((iVar4 != 0) && ((pLVar1->elements_int & 4) != 0)) {
          EStack_40.map_.flat = (KeyValue *)0x257c60;
          LongSooRep::elements(pLVar1);
        }
        RepeatedField<float>::set_size((RepeatedField<float> *)pLVar1,(uVar2 & 4) == 0,0);
        return;
      case 7:
        pLVar1 = *(LongSooRep **)&(this->field_0).int32_t_value;
        uVar2 = pLVar1->elements_int;
        if ((uVar2 & 4) != 0) {
          EStack_40.map_.flat = (KeyValue *)0x257b73;
          LongSooRep::elements(pLVar1);
        }
        bVar13 = (uVar2 & 4) == 0;
        EStack_40.map_.flat = (KeyValue *)0x257b87;
        SooRep::size((SooRep *)pLVar1,bVar13);
        EStack_40.map_.flat = (KeyValue *)0x257b91;
        iVar4 = SooRep::size((SooRep *)pLVar1,bVar13);
        if ((iVar4 != 0) && ((pLVar1->elements_int & 4) != 0)) {
          EStack_40.map_.flat = (KeyValue *)0x257ba2;
          LongSooRep::elements(pLVar1);
        }
        RepeatedField<bool>::set_size((RepeatedField<bool> *)pLVar1,(uVar2 & 4) == 0,0);
        return;
      case 9:
        RepeatedPtrFieldBase::
        Clear<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                  ((RepeatedPtrFieldBase *)this->field_0);
        return;
      case 10:
        RepeatedPtrFieldBase::
        Clear<google::protobuf::internal::GenericTypeHandler<google::protobuf::MessageLite>>
                  ((RepeatedPtrFieldBase *)this->field_0);
        return;
      default:
        return;
      }
      bVar13 = (uVar2 & 4) == 0;
      EStack_40.map_.flat = (KeyValue *)0x257b28;
      SooRep::size((SooRep *)pLVar1,bVar13);
      EStack_40.map_.flat = (KeyValue *)0x257b32;
      iVar4 = SooRep::size((SooRep *)pLVar1,bVar13);
      if ((iVar4 != 0) && ((pLVar1->elements_int & 4) != 0)) {
        EStack_40.map_.flat = (KeyValue *)0x257b43;
        LongSooRep::elements(pLVar1);
      }
      RepeatedField<unsigned_int>::set_size
                ((RepeatedField<unsigned_int> *)pLVar1,(uVar2 & 4) == 0,0);
      return;
    }
    EStack_40.map_.flat = (KeyValue *)0x257ca7;
    Clear((Extension *)&stack0xffffffffffffffd8);
  }
  else {
    if ((this->field_0xa & 2) != 0) {
      return;
    }
    plVar8 = (long *)(ulong)this->type;
    if (0xed < (byte)(this->type - 0x13)) {
      if (*(int *)(WireFormatLite::kFieldTypeToCppTypeMap + (long)plVar8 * 4) == 10) {
        if ((this->field_0xa & 4) == 0) {
          EStack_40.map_.flat = (KeyValue *)0x257a2d;
          (**(code **)(*(long *)this->field_0 + 0x10))();
        }
        else {
          EStack_40.map_.flat = (KeyValue *)0x257c92;
          (**(code **)(*(long *)this->field_0 + 0x88))();
        }
      }
      else if (*(int *)(WireFormatLite::kFieldTypeToCppTypeMap + (long)plVar8 * 4) == 9) {
        puVar3 = (undefined8 *)(this->field_0).int64_t_value;
        puVar3[1] = 0;
        *(undefined1 *)*puVar3 = 0;
      }
      this->field_0xa = this->field_0xa | 2;
      return;
    }
  }
  EStack_40.map_.flat = (KeyValue *)0x257caf;
  Clear((Extension *)&stack0xffffffffffffffd8);
  pEVar11 = &EStack_40;
  iVar4 = (int)&EStack_40;
  AVar10._4_4_ = 0;
  AVar10._0_4_ = extraout_EDX;
  EStack_58.map_.flat = (KeyValue *)0x257cbc;
  EStack_40.map_ = (AllocatedData)this;
  pEVar5 = FindOrNull(pEVar12,in_ESI);
  if ((pEVar5 == (Extension *)0x0) || ((pEVar5->field_0xa & 2) != 0)) {
    return;
  }
  if (pEVar5->is_repeated == false) {
    plVar8 = (long *)(ulong)pEVar5->type;
    if ((byte)(pEVar5->type - 0x13) < 0xee) goto LAB_00257cfa;
    pEVar11 = (ExtensionSet *)
              (ulong)*(uint *)(WireFormatLite::kFieldTypeToCppTypeMap + (long)plVar8 * 4);
    if (*(uint *)(WireFormatLite::kFieldTypeToCppTypeMap + (long)plVar8 * 4) == 1) {
      return;
    }
  }
  else {
    EStack_58.map_.flat = (KeyValue *)0x257cfa;
    GetInt32();
LAB_00257cfa:
    EStack_58.map_.flat = (KeyValue *)0x257d02;
    GetInt32();
  }
  EStack_58.map_.flat = (KeyValue *)GetRefInt32;
  GetInt32();
  pEVar12 = &EStack_58;
  key = (int)&EStack_58;
  EStack_58.map_ = AVar10;
  EStack_80.map_.flat = (KeyValue *)FindOrNull(pEVar11,iVar4);
  if ((EStack_80.map_.flat == (KeyValue *)0x0) ||
     ((((EStack_80.map_.flat)->second).field_0.uint64_t_value & 0x20000) != 0)) {
    return;
  }
  if (*(bool *)((long)&((EStack_80.map_.flat)->second).field_0 + 1) == false) {
    bVar13 = ((EStack_80.map_.flat)->second).field_0.bool_value;
    plVar8 = (long *)(ulong)bVar13;
    if ((byte)(bVar13 - 0x13U) < 0xee) goto LAB_00257d57;
    pEVar12 = (ExtensionSet *)
              (ulong)*(uint *)(WireFormatLite::kFieldTypeToCppTypeMap + (long)plVar8 * 4);
    if (*(uint *)(WireFormatLite::kFieldTypeToCppTypeMap + (long)plVar8 * 4) == 1) {
      return;
    }
  }
  else {
    GetRefInt32();
LAB_00257d57:
    GetRefInt32();
    EStack_80.map_ = extraout_RDX;
  }
  GetRefInt32();
  pEVar11 = &EStack_80;
  iVar4 = (int)&EStack_80;
  plVar9 = plVar8;
  pVar14 = Insert(pEVar12,key);
  pEVar5 = pVar14.first;
  pEVar5->descriptor = in_R8;
  if (((undefined1  [16])pVar14 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    if (pEVar5->is_repeated != false) goto LAB_00257df1;
    plVar9 = (long *)(ulong)pEVar5->type;
    if (0xed < (byte)(pEVar5->type - 0x13)) {
      pEVar11 = (ExtensionSet *)
                (ulong)*(uint *)(WireFormatLite::kFieldTypeToCppTypeMap + (long)plVar9 * 4);
      if (*(uint *)(WireFormatLite::kFieldTypeToCppTypeMap + (long)plVar9 * 4) == 1) {
        bVar6 = pEVar5->field_0xa;
        goto LAB_00257dd7;
      }
      goto LAB_00257e09;
    }
  }
  else {
    pEVar5->type = (FieldType)extraout_EDX_00;
    plVar9 = (long *)(ulong)(extraout_EDX_00 - 0x13);
    if ((byte)(extraout_EDX_00 - 0x13) < 0xee) {
      SetInt32(&EStack_80);
LAB_00257df1:
      SetInt32(&EStack_80);
    }
    else {
      plVar9 = (long *)(ulong)(extraout_EDX_00 & 0xff);
      if (*(int *)(WireFormatLite::kFieldTypeToCppTypeMap + (long)plVar9 * 4) == 1) {
        pEVar5->is_repeated = false;
        bVar6 = pEVar5->field_0xa & 0xfe;
LAB_00257dd7:
        pEVar5->field_0xa = bVar6 & 0xfd;
        (pEVar5->field_0).int32_t_value = (int32_t)plVar8;
        return;
      }
    }
    SetInt32();
  }
  SetInt32(&EStack_80);
LAB_00257e09:
  SetInt32();
  pVar14 = Insert(pEVar11,iVar4);
  *plVar9 = (long)pVar14.first;
  (pVar14.first)->descriptor = extraout_RDX_00;
  return;
}

Assistant:

void ExtensionSet::Extension::Clear() {
  if (is_repeated) {
    switch (cpp_type(type)) {
#define HANDLE_TYPE(UPPERCASE, LOWERCASE)      \
  case WireFormatLite::CPPTYPE_##UPPERCASE:    \
    ptr.repeated_##LOWERCASE##_value->Clear(); \
    break

      HANDLE_TYPE(INT32, int32_t);
      HANDLE_TYPE(INT64, int64_t);
      HANDLE_TYPE(UINT32, uint32_t);
      HANDLE_TYPE(UINT64, uint64_t);
      HANDLE_TYPE(FLOAT, float);
      HANDLE_TYPE(DOUBLE, double);
      HANDLE_TYPE(BOOL, bool);
      HANDLE_TYPE(ENUM, enum);
      HANDLE_TYPE(STRING, string);
      HANDLE_TYPE(MESSAGE, message);
#undef HANDLE_TYPE
    }
  } else {
    if (!is_cleared) {
      switch (cpp_type(type)) {
        case WireFormatLite::CPPTYPE_STRING:
          ptr.string_value->clear();
          break;
        case WireFormatLite::CPPTYPE_MESSAGE:
          if (is_lazy) {
            ptr.lazymessage_value->Clear();
          } else {
            ptr.message_value->Clear();
          }
          break;
        default:
          // No need to do anything.  Get*() will return the default value
          // as long as is_cleared is true and Set*() will overwrite the
          // previous value.
          break;
      }

      is_cleared = true;
    }
  }
}